

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O2

String * __thiscall
kj::encodeWwwForm(String *__return_storage_ptr__,kj *this,ArrayPtr<const_unsigned_char> bytes)

{
  String *pSVar1;
  uint uVar2;
  uchar *puVar3;
  uchar *puVar4;
  byte b;
  Vector<char> result;
  kj local_72;
  char local_71;
  String *local_70;
  ArrayBuilder<char> local_68;
  Array<char> local_48;
  
  puVar3 = bytes.ptr;
  local_70 = __return_storage_ptr__;
  local_68.ptr = _::HeapArrayDisposer::allocateUninitialized<char>((size_t)(puVar3 + 1));
  local_68.endPtr = local_68.ptr + (long)puVar3 + 1;
  local_68.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  puVar4 = (uchar *)0x0;
  local_68.pos = local_68.ptr;
  do {
    if (puVar3 == puVar4) {
      local_72 = (kj)0x0;
      Vector<char>::add<char>((Vector<char> *)&local_68,(char *)&local_72);
      Vector<char>::releaseAsArray(&local_48,(Vector<char> *)&local_68);
      pSVar1 = local_70;
      (local_70->content).ptr = local_48.ptr;
      (local_70->content).size_ = local_48.size_;
      (local_70->content).disposer = local_48.disposer;
      local_48.ptr = (char *)0x0;
      local_48.size_ = 0;
      Array<char>::~Array(&local_48);
      ArrayBuilder<char>::dispose(&local_68);
      return pSVar1;
    }
    local_72 = this[(long)puVar4];
    if (((byte)((char)local_72 - 0x30U) < 10) || ((byte)(((byte)local_72 & 0xdf) + 0xbf) < 0x1a)) {
LAB_003adcac:
      Vector<char>::add<unsigned_char&>((Vector<char> *)&local_68,(uchar *)&local_72);
    }
    else {
      uVar2 = (byte)local_72 - 0x20;
      if (uVar2 < 0x40) {
        if ((0x8000000000006400U >> ((ulong)uVar2 & 0x3f) & 1) != 0) goto LAB_003adcac;
        if ((ulong)uVar2 != 0) goto LAB_003adcd5;
        local_71 = '+';
        Vector<char>::add<char>((Vector<char> *)&local_68,&local_71);
      }
      else {
LAB_003adcd5:
        local_71 = '%';
        Vector<char>::add<char>((Vector<char> *)&local_68,&local_71);
        Vector<char>::add<char_const&>
                  ((Vector<char> *)&local_68,"0123456789ABCDEF" + ((byte)local_72 >> 4));
        Vector<char>::add<char_const&>
                  ((Vector<char> *)&local_68,"0123456789ABCDEF" + ((byte)local_72 & 0xf));
      }
    }
    puVar4 = puVar4 + 1;
  } while( true );
}

Assistant:

String encodeWwwForm(ArrayPtr<const byte> bytes) {
  Vector<char> result(bytes.size() + 1);
  for (byte b: bytes) {
    if (('A' <= b && b <= 'Z') ||
        ('a' <= b && b <= 'z') ||
        ('0' <= b && b <= '9') ||
        b == '-' || b == '_' || b == '.' || b == '*') {
      result.add(b);
    } else if (b == ' ') {
      result.add('+');
    } else {
      result.add('%');
      result.add(HEX_DIGITS_URI[b/16]);
      result.add(HEX_DIGITS_URI[b%16]);
    }
  }
  result.add('\0');
  return String(result.releaseAsArray());
}